

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::Initialize(Solver *this,int argc,char **argv)

{
  print_logo(this);
  checker(this,argc,argv);
  init_log(this);
  if ((this->hyper_param_).is_train == true) {
    init_train(this);
    return;
  }
  init_predict(this);
  return;
}

Assistant:

void Solver::Initialize(int argc, char* argv[]) {
  //  Print logo
  print_logo();
  // Check and parse command line arguments
  checker(argc, argv);
  // Initialize log file
  init_log();
  // Init train or predict
  if (hyper_param_.is_train) {
    init_train();
  } else {
    init_predict();
  }
}